

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

void P_Thing_SetVelocity(AActor *actor,DVector3 *vec,bool add,bool setbob)

{
  player_t *ppVar1;
  double dVar2;
  
  if (actor != (AActor *)0x0) {
    if (!add) {
      (actor->Vel).Z = 0.0;
      (actor->Vel).X = 0.0;
      (actor->Vel).Y = 0.0;
      ppVar1 = actor->player;
      if (ppVar1 != (player_t *)0x0) {
        (ppVar1->Vel).X = 0.0;
        (ppVar1->Vel).Y = 0.0;
      }
    }
    TVector3<double>::operator+=(&actor->Vel,vec);
    if ((setbob) && (ppVar1 = actor->player, ppVar1 != (player_t *)0x0)) {
      dVar2 = vec->Y;
      (ppVar1->Vel).X = (ppVar1->Vel).X + vec->X;
      (ppVar1->Vel).Y = (ppVar1->Vel).Y + dVar2;
    }
  }
  return;
}

Assistant:

void P_Thing_SetVelocity(AActor *actor, const DVector3 &vec, bool add, bool setbob)
{
	if (actor != NULL)
	{
		if (!add)
		{
			actor->Vel.Zero();
			if (actor->player != NULL) actor->player->Vel.Zero();
		}
		actor->Vel += vec;
		if (setbob && actor->player != NULL)
		{
			actor->player->Vel += vec.XY();
		}
	}
}